

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *loop;
  uv_loop_t *puVar3;
  uv_loop_t *handle;
  char cVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int fds_stdout [2];
  int fds_stdin [2];
  uv_stdio_container_t child_stdio [2];
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_child;
  uchar ubuf [1023];
  uv_process_t child_req;
  uv_write_t write_req;
  undefined1 local_9c8 [12];
  uv_file local_9bc;
  uv_buf_t local_9b8;
  anon_union_16_2_bf76bca6_for_active_reqs local_9a8;
  uint local_998;
  uv_loop_t *local_990;
  undefined1 local_988 [264];
  undefined1 local_880 [264];
  undefined1 local_778 [264];
  undefined1 local_670 [265];
  char acStack_567 [1023];
  uv_process_t local_168;
  long lVar7;
  
  handle = (uv_loop_t *)local_9c8;
  init_process_options("spawn_helper9",exit_cb);
  loop = uv_default_loop();
  puVar3 = loop;
  iVar1 = uv_pipe_init(loop,(uv_pipe_t *)local_670,0);
  if (iVar1 == 0) {
    puVar3 = loop;
    iVar1 = uv_pipe_init(loop,(uv_pipe_t *)local_778,0);
    if (iVar1 != 0) goto LAB_0016ccf9;
    puVar3 = loop;
    iVar1 = uv_pipe_init(loop,(uv_pipe_t *)local_880,0);
    if (iVar1 != 0) goto LAB_0016ccfe;
    puVar3 = loop;
    iVar1 = uv_pipe_init(loop,(uv_pipe_t *)local_988,0);
    if (iVar1 != 0) goto LAB_0016cd03;
    puVar3 = (uv_loop_t *)(local_9c8 + 8);
    iVar1 = mpipe((int *)puVar3);
    if (iVar1 == -1) goto LAB_0016cd08;
    iVar1 = mpipe((int *)local_9c8);
    if (iVar1 == -1) goto LAB_0016cd0d;
    handle = (uv_loop_t *)local_670;
    iVar1 = uv_pipe_open((uv_pipe_t *)handle,local_9c8._8_4_);
    if (iVar1 != 0) goto LAB_0016cd12;
    handle = (uv_loop_t *)local_778;
    iVar1 = uv_pipe_open((uv_pipe_t *)handle,local_9c8._4_4_);
    if (iVar1 != 0) goto LAB_0016cd17;
    handle = (uv_loop_t *)local_880;
    iVar1 = uv_pipe_open((uv_pipe_t *)handle,local_9bc);
    if (iVar1 != 0) goto LAB_0016cd1c;
    handle = (uv_loop_t *)local_988;
    iVar1 = uv_pipe_open((uv_pipe_t *)handle,local_9c8._0_4_);
    if (iVar1 != 0) goto LAB_0016cd21;
    handle = (uv_loop_t *)local_670;
    iVar1 = uv_is_readable((uv_stream_t *)handle);
    if (iVar1 == 0) goto LAB_0016cd26;
    handle = (uv_loop_t *)local_778;
    iVar1 = uv_is_writable((uv_stream_t *)handle);
    if (iVar1 == 0) goto LAB_0016cd2b;
    handle = (uv_loop_t *)local_880;
    iVar1 = uv_is_writable((uv_stream_t *)handle);
    if (iVar1 == 0) goto LAB_0016cd30;
    handle = (uv_loop_t *)local_988;
    iVar1 = uv_is_readable((uv_stream_t *)handle);
    if (iVar1 == 0) goto LAB_0016cd35;
    iVar1 = uv_is_writable((uv_stream_t *)local_670);
    handle = (uv_loop_t *)local_778;
    iVar2 = uv_is_readable((uv_stream_t *)local_778);
    if (iVar2 != iVar1) goto LAB_0016cd3a;
    handle = (uv_loop_t *)local_880;
    iVar2 = uv_is_readable((uv_stream_t *)handle);
    if (iVar2 != iVar1) goto LAB_0016cd3f;
    handle = (uv_loop_t *)local_988;
    iVar2 = uv_is_writable((uv_stream_t *)handle);
    if (iVar2 != iVar1) goto LAB_0016cd44;
    options.stdio = (uv_stdio_container_t *)&local_9a8;
    local_9a8.count = 4;
    local_998 = 4;
    options.stdio_count = 2;
    handle = loop;
    local_9a8.unused[1] = (uv_stream_t *)local_670;
    local_990 = (uv_loop_t *)local_778;
    iVar1 = uv_spawn(loop,(uv_process_t *)(acStack_567 + 0x3ff),&options);
    if (iVar1 != 0) goto LAB_0016cd49;
    puVar3 = (uv_loop_t *)(local_670 + 0x108);
    lVar5 = 0;
    uv_close((uv_handle_t *)local_670,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)local_778,(uv_close_cb)0x0);
    local_9b8 = uv_buf_init(local_670 + 0x108,0x3ff);
    auVar6 = _DAT_0019f380;
    auVar8 = _DAT_0019f390;
    auVar9 = _DAT_0019f3a0;
    auVar10 = _DAT_0019f3b0;
    auVar11 = _DAT_0019f3c0;
    auVar12 = _DAT_0019f3d0;
    auVar13 = _DAT_0019f3e0;
    auVar14 = _DAT_0019f3f0;
    do {
      auVar15 = auVar14 ^ _DAT_0019f410;
      iVar1 = auVar15._0_4_;
      iVar2 = auVar15._8_4_;
      auVar24._4_4_ = iVar1;
      auVar24._0_4_ = iVar1;
      auVar24._8_4_ = iVar2;
      auVar24._12_4_ = iVar2;
      auVar32._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar32._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar32._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar32._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar16._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar16._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar16._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar16._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar16 = auVar16 & auVar32;
      auVar15 = pshuflw(auVar24,auVar16,0xe8);
      auVar15 = packssdw(auVar15,auVar15);
      cVar4 = (char)lVar5;
      if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_670[lVar5 + 0x108] = cVar4;
      }
      auVar15 = packssdw(auVar16,auVar16);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15._0_4_ >> 8 & 1) != 0) {
        acStack_567[lVar5] = cVar4 + '\x01';
      }
      auVar15 = auVar13 ^ _DAT_0019f410;
      iVar1 = auVar15._0_4_;
      iVar2 = auVar15._8_4_;
      auVar25._4_4_ = iVar1;
      auVar25._0_4_ = iVar1;
      auVar25._8_4_ = iVar2;
      auVar25._12_4_ = iVar2;
      auVar33._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar33._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar33._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar33._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar17._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar17._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar17._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar17._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar17 = auVar17 & auVar33;
      auVar15 = packssdw(auVar25,auVar17);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15._0_4_ >> 0x10 & 1) != 0) {
        acStack_567[lVar5 + 1] = cVar4 + '\x02';
      }
      auVar15 = pshufhw(auVar17,auVar17,0x84);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15._0_4_ >> 0x18 & 1) != 0) {
        acStack_567[lVar5 + 2] = cVar4 + '\x03';
      }
      auVar15 = auVar12 ^ _DAT_0019f410;
      iVar1 = auVar15._0_4_;
      iVar2 = auVar15._8_4_;
      auVar26._4_4_ = iVar1;
      auVar26._0_4_ = iVar1;
      auVar26._8_4_ = iVar2;
      auVar26._12_4_ = iVar2;
      auVar34._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar34._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar34._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar34._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar18._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar18._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar18._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar18._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar18 = auVar18 & auVar34;
      auVar15 = pshuflw(auVar26,auVar18,0xe8);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_567[lVar5 + 3] = cVar4 + '\x04';
      }
      auVar15 = packssdw(auVar18,auVar18);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15._4_2_ >> 8 & 1) != 0) {
        acStack_567[lVar5 + 4] = cVar4 + '\x05';
      }
      auVar15 = auVar11 ^ _DAT_0019f410;
      iVar1 = auVar15._0_4_;
      iVar2 = auVar15._8_4_;
      auVar27._4_4_ = iVar1;
      auVar27._0_4_ = iVar1;
      auVar27._8_4_ = iVar2;
      auVar27._12_4_ = iVar2;
      auVar35._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar35._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar35._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar35._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar19._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar19._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar19._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar19._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar19 = auVar19 & auVar35;
      auVar15 = packssdw(auVar27,auVar19);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_567[lVar5 + 5] = cVar4 + '\x06';
      }
      auVar15 = pshufhw(auVar19,auVar19,0x84);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15._6_2_ >> 8 & 1) != 0) {
        acStack_567[lVar5 + 6] = cVar4 + '\a';
      }
      auVar15 = auVar10 ^ _DAT_0019f410;
      iVar1 = auVar15._0_4_;
      iVar2 = auVar15._8_4_;
      auVar28._4_4_ = iVar1;
      auVar28._0_4_ = iVar1;
      auVar28._8_4_ = iVar2;
      auVar28._12_4_ = iVar2;
      auVar36._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar36._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar36._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar36._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar20._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar20._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar20._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar20._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar20 = auVar20 & auVar36;
      auVar15 = pshuflw(auVar28,auVar20,0xe8);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        acStack_567[lVar5 + 7] = cVar4 + '\b';
      }
      auVar15 = packssdw(auVar20,auVar20);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15._8_2_ >> 8 & 1) != 0) {
        acStack_567[lVar5 + 8] = cVar4 + '\t';
      }
      auVar15 = auVar9 ^ _DAT_0019f410;
      iVar1 = auVar15._0_4_;
      iVar2 = auVar15._8_4_;
      auVar29._4_4_ = iVar1;
      auVar29._0_4_ = iVar1;
      auVar29._8_4_ = iVar2;
      auVar29._12_4_ = iVar2;
      auVar37._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar37._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar37._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar37._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar21._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar21._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar21._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar21._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar21 = auVar21 & auVar37;
      auVar15 = packssdw(auVar29,auVar21);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        acStack_567[lVar5 + 9] = cVar4 + '\n';
      }
      auVar15 = pshufhw(auVar21,auVar21,0x84);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15._10_2_ >> 8 & 1) != 0) {
        acStack_567[lVar5 + 10] = cVar4 + '\v';
      }
      auVar15 = auVar8 ^ _DAT_0019f410;
      iVar1 = auVar15._0_4_;
      iVar2 = auVar15._8_4_;
      auVar30._4_4_ = iVar1;
      auVar30._0_4_ = iVar1;
      auVar30._8_4_ = iVar2;
      auVar30._12_4_ = iVar2;
      auVar38._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar38._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar38._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar38._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar22._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar22._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar22._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar22._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar22 = auVar22 & auVar38;
      auVar15 = pshuflw(auVar30,auVar22,0xe8);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_567[lVar5 + 0xb] = cVar4 + '\f';
      }
      auVar15 = packssdw(auVar22,auVar22);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15._12_2_ >> 8 & 1) != 0) {
        acStack_567[lVar5 + 0xc] = cVar4 + '\r';
      }
      auVar15 = auVar6 ^ _DAT_0019f410;
      iVar1 = auVar15._0_4_;
      iVar2 = auVar15._8_4_;
      auVar31._4_4_ = iVar1;
      auVar31._0_4_ = iVar1;
      auVar31._8_4_ = iVar2;
      auVar31._12_4_ = iVar2;
      auVar39._0_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar39._4_4_ = -(uint)(iVar1 < -0x7ffffc01);
      auVar39._8_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar39._12_4_ = -(uint)(iVar2 < -0x7ffffc01);
      auVar23._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar23._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
      auVar23._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar23._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
      auVar23 = auVar23 & auVar39;
      auVar15 = packssdw(auVar31,auVar23);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_567[lVar5 + 0xd] = cVar4 + '\x0e';
      }
      auVar15 = pshufhw(auVar23,auVar23,0x84);
      auVar15 = packssdw(auVar15,auVar15);
      auVar15 = packsswb(auVar15,auVar15);
      if ((auVar15._14_2_ >> 8 & 1) != 0) {
        acStack_567[lVar5 + 0xe] = cVar4 + '\x0f';
      }
      lVar5 = lVar5 + 0x10;
      lVar7 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 0x10;
      auVar14._8_8_ = lVar7 + 0x10;
      lVar7 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 0x10;
      auVar13._8_8_ = lVar7 + 0x10;
      lVar7 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 0x10;
      auVar12._8_8_ = lVar7 + 0x10;
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 0x10;
      auVar11._8_8_ = lVar7 + 0x10;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 0x10;
      auVar10._8_8_ = lVar7 + 0x10;
      lVar7 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 0x10;
      auVar9._8_8_ = lVar7 + 0x10;
      lVar7 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 0x10;
      auVar8._8_8_ = lVar7 + 0x10;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 0x10;
      auVar6._8_8_ = lVar7 + 0x10;
    } while (lVar5 != 0x400);
    memset(output,0,0x3ff);
    handle = (uv_loop_t *)&stack0xffffffffffffff20;
    iVar1 = uv_write((uv_write_t *)handle,(uv_stream_t *)local_880,&local_9b8,1,write_cb);
    if (iVar1 != 0) goto LAB_0016cd4e;
    handle = (uv_loop_t *)local_988;
    iVar1 = uv_read_start((uv_stream_t *)handle,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0016cd53;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016cd58;
    if (exit_cb_called != 1) goto LAB_0016cd5d;
    if (close_cb_called != 3) goto LAB_0016cd62;
    iVar1 = bcmp(puVar3,output,0x3ff);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016cd6c;
    }
  }
  else {
    run_test_spawn_inherit_streams_cold_1();
LAB_0016ccf9:
    run_test_spawn_inherit_streams_cold_2();
LAB_0016ccfe:
    run_test_spawn_inherit_streams_cold_3();
LAB_0016cd03:
    run_test_spawn_inherit_streams_cold_4();
LAB_0016cd08:
    handle = puVar3;
    run_test_spawn_inherit_streams_cold_25();
LAB_0016cd0d:
    run_test_spawn_inherit_streams_cold_24();
LAB_0016cd12:
    run_test_spawn_inherit_streams_cold_5();
LAB_0016cd17:
    run_test_spawn_inherit_streams_cold_6();
LAB_0016cd1c:
    run_test_spawn_inherit_streams_cold_7();
LAB_0016cd21:
    run_test_spawn_inherit_streams_cold_8();
LAB_0016cd26:
    run_test_spawn_inherit_streams_cold_23();
LAB_0016cd2b:
    run_test_spawn_inherit_streams_cold_22();
LAB_0016cd30:
    run_test_spawn_inherit_streams_cold_21();
LAB_0016cd35:
    run_test_spawn_inherit_streams_cold_20();
LAB_0016cd3a:
    run_test_spawn_inherit_streams_cold_9();
LAB_0016cd3f:
    run_test_spawn_inherit_streams_cold_10();
LAB_0016cd44:
    run_test_spawn_inherit_streams_cold_11();
LAB_0016cd49:
    run_test_spawn_inherit_streams_cold_12();
LAB_0016cd4e:
    run_test_spawn_inherit_streams_cold_13();
LAB_0016cd53:
    loop = handle;
    run_test_spawn_inherit_streams_cold_14();
LAB_0016cd58:
    run_test_spawn_inherit_streams_cold_15();
LAB_0016cd5d:
    run_test_spawn_inherit_streams_cold_16();
LAB_0016cd62:
    puVar3 = loop;
    run_test_spawn_inherit_streams_cold_17();
  }
  run_test_spawn_inherit_streams_cold_18();
LAB_0016cd6c:
  run_test_spawn_inherit_streams_cold_19();
  iVar1 = pipe((int *)puVar3);
  if (iVar1 != -1) {
    iVar1 = fcntl64(*(undefined4 *)&puVar3->data,2,1);
    if ((iVar1 != -1) &&
       (iVar1 = fcntl64(*(undefined4 *)((long)&puVar3->data + 4),2,1), iVar1 != -1)) {
      return 0;
    }
    close(*(int *)&puVar3->data);
    close(*(int *)((long)&puVar3->data + 4));
  }
  return -1;
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  int fds_stdin[2];
  int fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT(uv_pipe_init(loop, &pipe_stdin_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdin_parent, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_parent, 0) == 0);

  ASSERT(mpipe(fds_stdin) != -1);
  ASSERT(mpipe(fds_stdout) != -1);

  ASSERT(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]) == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_child) == bidir);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_parent) == bidir);
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_parent) == bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *)&pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *)&pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT(uv_spawn(loop, &child_req, &options) == 0);

  uv_close((uv_handle_t*)&pipe_stdin_child, NULL);
  uv_close((uv_handle_t*)&pipe_stdout_child, NULL);

  buf = uv_buf_init((char*)ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*)&pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*)&pipe_stdout_parent, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}